

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_layout.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_3::FunctionScopedInstructions
          (ValidationState_t *_,Instruction *inst,Op opcode)

{
  uint32_t ret_type_id;
  uint32_t id;
  bool bVar1;
  bool bVar2;
  ModuleLayoutSection MVar3;
  FunctionControlMask function_control;
  uint uVar4;
  spv_result_t sVar5;
  Function *pFVar6;
  size_t sVar7;
  DiagnosticStream *pDVar8;
  long lVar9;
  spv_result_t unaff_EBP;
  char *pcVar10;
  char *local_210;
  DiagnosticStream local_208;
  
  MVar3 = ValidationState_t::current_layout_section(_);
  if ((MVar3 == kLayoutFunctionDeclarations) &&
     (bVar1 = ValidationState_t::IsOpcodeInCurrentLayoutSection(_,opcode), !bVar1)) {
    ValidationState_t::ProgressToNextLayoutSectionOrder(_);
    bVar1 = ValidationState_t::in_function_body(_);
    if (bVar1) {
      pFVar6 = ValidationState_t::current_function(_);
      unaff_EBP = val::Function::RegisterSetFunctionDeclType(pFVar6,kFunctionDeclDefinition);
      if (unaff_EBP != SPV_SUCCESS) {
        return unaff_EBP;
      }
    }
  }
  bVar1 = ValidationState_t::IsOpcodeInCurrentLayoutSection(_,opcode);
  if (bVar1) {
    if (0x37 < (int)opcode) {
      if ((int)opcode < 0x13d) {
        if (opcode == OpFunctionEnd) {
          bVar1 = ValidationState_t::in_function_body(_);
          if (bVar1) {
            bVar1 = ValidationState_t::in_block(_);
            if (bVar1) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
              pcVar10 = "Function end cannot be called in blocks";
              lVar9 = 0x27;
            }
            else {
              pFVar6 = ValidationState_t::current_function(_);
              sVar7 = val::Function::block_count(pFVar6);
              if ((sVar7 != 0) ||
                 (MVar3 = ValidationState_t::current_layout_section(_),
                 MVar3 != kLayoutFunctionDefinitions)) {
                MVar3 = ValidationState_t::current_layout_section(_);
                if (MVar3 == kLayoutFunctionDeclarations) {
                  pFVar6 = ValidationState_t::current_function(_);
                  sVar5 = val::Function::RegisterSetFunctionDeclType
                                    (pFVar6,kFunctionDeclDeclaration);
                  if (sVar5 != SPV_SUCCESS) {
                    return sVar5;
                  }
                }
                sVar5 = ValidationState_t::RegisterFunctionEnd(_);
                goto LAB_0065370d;
              }
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
              pcVar10 = "Function declarations must appear before function definitions.";
              lVar9 = 0x3e;
            }
          }
          else {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
            pcVar10 = "Function end instructions must be in a function body";
            lVar9 = 0x34;
          }
        }
        else {
          if (opcode != OpLabel) goto LAB_006533d0;
          bVar1 = ValidationState_t::in_function_body(_);
          if (bVar1) {
            bVar1 = ValidationState_t::in_block(_);
            if (!bVar1) {
              return SPV_SUCCESS;
            }
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
            pcVar10 = "A block must end with a branch instruction.";
            lVar9 = 0x2b;
          }
          else {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
            pcVar10 = "Label instructions must be in a function body";
            lVar9 = 0x2d;
          }
        }
      }
      else {
        if (opcode == OpNoLine) {
          return SPV_SUCCESS;
        }
        if (opcode == OpExtInstWithForwardRefsKHR) goto LAB_0065323d;
LAB_006533d0:
        MVar3 = ValidationState_t::current_layout_section(_);
        if ((MVar3 != kLayoutFunctionDeclarations) ||
           (bVar1 = ValidationState_t::in_function_body(_), !bVar1)) goto LAB_00653415;
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
        pcVar10 = "A function must begin with a label";
        lVar9 = 0x22;
      }
LAB_00653552:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar10,lVar9);
      goto LAB_00653564;
    }
    if (0x35 < (int)opcode) {
      if (opcode == OpFunction) {
        bVar1 = ValidationState_t::in_function_body(_);
        if (!bVar1) {
          function_control = Instruction::GetOperandAs<spv::FunctionControlMask>(inst,2);
          ret_type_id = (inst->inst_).type_id;
          id = (inst->inst_).result_id;
          uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,3);
          local_208.error_ =
               ValidationState_t::RegisterFunction(_,id,ret_type_id,function_control,uVar4);
          if (local_208.error_ == SPV_SUCCESS) {
            MVar3 = ValidationState_t::current_layout_section(_);
            bVar1 = true;
            if (MVar3 == kLayoutFunctionDefinitions) {
              pFVar6 = ValidationState_t::current_function(_);
              sVar5 = val::Function::RegisterSetFunctionDeclType(pFVar6,kFunctionDeclDefinition);
              bVar1 = sVar5 == SPV_SUCCESS;
              if (!bVar1) {
                unaff_EBP = sVar5;
              }
            }
            goto LAB_00653618;
          }
          goto LAB_00653616;
        }
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
        pcVar10 = "Cannot declare a function in a function body";
        lVar9 = 0x2c;
      }
      else {
        if (opcode != OpFunctionParameter) goto LAB_006533d0;
        bVar1 = ValidationState_t::in_function_body(_);
        if (bVar1) {
          pFVar6 = ValidationState_t::current_function(_);
          sVar7 = val::Function::block_count(pFVar6);
          if (sVar7 == 0) {
            pFVar6 = ValidationState_t::current_function(_);
            sVar5 = val::Function::RegisterFunctionParameter
                              (pFVar6,(inst->inst_).result_id,(inst->inst_).type_id);
LAB_0065370d:
            if (sVar5 == SPV_SUCCESS) {
              return SPV_SUCCESS;
            }
            return sVar5;
          }
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
          pcVar10 = "Function parameters must only appear immediately after the function definition"
          ;
          lVar9 = 0x4e;
        }
        else {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
          pcVar10 = "Function parameter instructions must be in a function body";
          lVar9 = 0x3a;
        }
      }
      goto LAB_00653552;
    }
    if (opcode == OpLine) {
      return SPV_SUCCESS;
    }
    if (opcode != OpExtInst) goto LAB_006533d0;
LAB_0065323d:
    bVar1 = spvExtInstIsDebugInfo((inst->inst_).ext_inst_type);
    if (bVar1) {
      uVar4 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start[4];
      bVar1 = (uVar4 & 0xfffffffe) == 0x1c || uVar4 - 0x17 < 2;
      if ((inst->inst_).ext_inst_type == SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
        bVar1 = bVar1 || (uVar4 == 0x65 || uVar4 - 0x67 < 2);
      }
      if (bVar1) {
        bVar2 = ValidationState_t::in_function_body(_);
        bVar1 = true;
        if (bVar2) goto LAB_00653618;
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"DebugScope, DebugNoScope, DebugDeclare, DebugValue ",0x33)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"of debug info extension must appear in a function ",0x32);
        pcVar10 = "body";
        lVar9 = 4;
      }
      else {
        MVar3 = ValidationState_t::current_layout_section(_);
        if (10 < (int)MVar3) {
          MVar3 = ValidationState_t::current_layout_section(_);
          bVar1 = true;
          if ((int)MVar3 < 0xc) goto LAB_00653618;
        }
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"Debug info extension instructions other than ",0x2d);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"DebugScope, DebugNoScope, DebugDeclare, DebugValue ",0x33)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"must appear between section 9 (types, constants, ",0x31);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"global variables) and section 10 (function ",0x2b);
        pcVar10 = "declarations)";
        lVar9 = 0xd;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar10,lVar9);
      DiagnosticStream::~DiagnosticStream(&local_208);
LAB_00653616:
      bVar1 = false;
      unaff_EBP = local_208.error_;
LAB_00653618:
      if (bVar1) {
        return SPV_SUCCESS;
      }
      return unaff_EBP;
    }
    bVar1 = spvExtInstIsNonSemantic((inst->inst_).ext_inst_type);
    if (bVar1) {
      MVar3 = ValidationState_t::current_layout_section(_);
      if ((int)MVar3 < 0xb) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"Non-semantic OpExtInst must not appear before types ",0x34
                  );
        pcVar10 = "section";
        lVar9 = 7;
      }
      else {
        bVar1 = ValidationState_t::in_function_body(_);
        if (!bVar1) {
          return SPV_SUCCESS;
        }
        bVar1 = ValidationState_t::in_block(_);
        if (bVar1) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
        pcVar10 = "Non-semantic OpExtInst within function definition must appear in a block";
        lVar9 = 0x48;
      }
      goto LAB_00653552;
    }
LAB_00653415:
    bVar1 = ValidationState_t::in_block(_);
    if (bVar1) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
    local_210 = spvOpcodeString(opcode);
    pDVar8 = DiagnosticStream::operator<<(&local_208,&local_210);
    pcVar10 = " must appear in a block";
    lVar9 = 0x17;
  }
  else {
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
    local_210 = spvOpcodeString(opcode);
    pDVar8 = DiagnosticStream::operator<<(&local_208,&local_210);
    pcVar10 = " cannot appear in a function declaration";
    lVar9 = 0x28;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar8,pcVar10,lVar9);
  local_208.error_ = pDVar8->error_;
LAB_00653564:
  DiagnosticStream::~DiagnosticStream(&local_208);
  return local_208.error_;
}

Assistant:

spv_result_t FunctionScopedInstructions(ValidationState_t& _,
                                        const Instruction* inst,
                                        spv::Op opcode) {
  // Make sure we advance into the function definitions when we hit
  // non-function declaration instructions.
  if (_.current_layout_section() == kLayoutFunctionDeclarations &&
      !_.IsOpcodeInCurrentLayoutSection(opcode)) {
    _.ProgressToNextLayoutSectionOrder();

    if (_.in_function_body()) {
      if (auto error = _.current_function().RegisterSetFunctionDeclType(
              FunctionDecl::kFunctionDeclDefinition)) {
        return error;
      }
    }
  }

  if (_.IsOpcodeInCurrentLayoutSection(opcode)) {
    switch (opcode) {
      case spv::Op::OpFunction: {
        if (_.in_function_body()) {
          return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                 << "Cannot declare a function in a function body";
        }
        auto control_mask = inst->GetOperandAs<spv::FunctionControlMask>(2);
        if (auto error =
                _.RegisterFunction(inst->id(), inst->type_id(), control_mask,
                                   inst->GetOperandAs<uint32_t>(3)))
          return error;
        if (_.current_layout_section() == kLayoutFunctionDefinitions) {
          if (auto error = _.current_function().RegisterSetFunctionDeclType(
                  FunctionDecl::kFunctionDeclDefinition))
            return error;
        }
      } break;

      case spv::Op::OpFunctionParameter:
        if (_.in_function_body() == false) {
          return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                 << "Function parameter instructions must be in a "
                    "function body";
        }
        if (_.current_function().block_count() != 0) {
          return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                 << "Function parameters must only appear immediately after "
                    "the function definition";
        }
        if (auto error = _.current_function().RegisterFunctionParameter(
                inst->id(), inst->type_id()))
          return error;
        break;

      case spv::Op::OpFunctionEnd:
        if (_.in_function_body() == false) {
          return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                 << "Function end instructions must be in a function body";
        }
        if (_.in_block()) {
          return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                 << "Function end cannot be called in blocks";
        }
        if (_.current_function().block_count() == 0 &&
            _.current_layout_section() == kLayoutFunctionDefinitions) {
          return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                 << "Function declarations must appear before "
                    "function definitions.";
        }
        if (_.current_layout_section() == kLayoutFunctionDeclarations) {
          if (auto error = _.current_function().RegisterSetFunctionDeclType(
                  FunctionDecl::kFunctionDeclDeclaration))
            return error;
        }
        if (auto error = _.RegisterFunctionEnd()) return error;
        break;

      case spv::Op::OpLine:
      case spv::Op::OpNoLine:
        break;
      case spv::Op::OpLabel:
        // If the label is encountered then the current function is a
        // definition so set the function to a declaration and update the
        // module section
        if (_.in_function_body() == false) {
          return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                 << "Label instructions must be in a function body";
        }
        if (_.in_block()) {
          return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                 << "A block must end with a branch instruction.";
        }
        break;

      case spv::Op::OpExtInst:
      case spv::Op::OpExtInstWithForwardRefsKHR:
        if (spvExtInstIsDebugInfo(inst->ext_inst_type())) {
          const uint32_t ext_inst_index = inst->word(4);
          bool local_debug_info = false;
          if (inst->ext_inst_type() == SPV_EXT_INST_TYPE_OPENCL_DEBUGINFO_100) {
            const OpenCLDebugInfo100Instructions ext_inst_key =
                OpenCLDebugInfo100Instructions(ext_inst_index);
            if (ext_inst_key == OpenCLDebugInfo100DebugScope ||
                ext_inst_key == OpenCLDebugInfo100DebugNoScope ||
                ext_inst_key == OpenCLDebugInfo100DebugDeclare ||
                ext_inst_key == OpenCLDebugInfo100DebugValue) {
              local_debug_info = true;
            }
          } else if (inst->ext_inst_type() ==
                     SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
            const NonSemanticShaderDebugInfo100Instructions ext_inst_key =
                NonSemanticShaderDebugInfo100Instructions(ext_inst_index);
            if (ext_inst_key == NonSemanticShaderDebugInfo100DebugScope ||
                ext_inst_key == NonSemanticShaderDebugInfo100DebugNoScope ||
                ext_inst_key == NonSemanticShaderDebugInfo100DebugDeclare ||
                ext_inst_key == NonSemanticShaderDebugInfo100DebugValue ||
                ext_inst_key == NonSemanticShaderDebugInfo100DebugLine ||
                ext_inst_key == NonSemanticShaderDebugInfo100DebugNoLine ||
                ext_inst_key ==
                    NonSemanticShaderDebugInfo100DebugFunctionDefinition) {
              local_debug_info = true;
            }
          } else {
            const DebugInfoInstructions ext_inst_key =
                DebugInfoInstructions(ext_inst_index);
            if (ext_inst_key == DebugInfoDebugScope ||
                ext_inst_key == DebugInfoDebugNoScope ||
                ext_inst_key == DebugInfoDebugDeclare ||
                ext_inst_key == DebugInfoDebugValue) {
              local_debug_info = true;
            }
          }

          if (local_debug_info) {
            if (_.in_function_body() == false) {
              // DebugScope, DebugNoScope, DebugDeclare, DebugValue must
              // appear in a function body.
              return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                     << "DebugScope, DebugNoScope, DebugDeclare, DebugValue "
                     << "of debug info extension must appear in a function "
                     << "body";
            }
          } else {
            // Debug info extinst opcodes other than DebugScope, DebugNoScope,
            // DebugDeclare, DebugValue must be placed between section 9 (types,
            // constants, global variables) and section 10 (function
            // declarations).
            if (_.current_layout_section() < kLayoutTypes ||
                _.current_layout_section() >= kLayoutFunctionDeclarations) {
              return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                     << "Debug info extension instructions other than "
                     << "DebugScope, DebugNoScope, DebugDeclare, DebugValue "
                     << "must appear between section 9 (types, constants, "
                     << "global variables) and section 10 (function "
                     << "declarations)";
            }
          }
        } else if (spvExtInstIsNonSemantic(inst->ext_inst_type())) {
          // non-semantic extinst opcodes are allowed beginning in the types
          // section, but must either be placed outside a function declaration,
          // or inside a block.
          if (_.current_layout_section() < kLayoutTypes) {
            return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                   << "Non-semantic OpExtInst must not appear before types "
                   << "section";
          } else if (_.in_function_body() && _.in_block() == false) {
            return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                   << "Non-semantic OpExtInst within function definition must "
                      "appear in a block";
          }
        } else {
          // otherwise they must be used in a block
          if (_.in_block() == false) {
            return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                   << spvOpcodeString(opcode) << " must appear in a block";
          }
        }
        break;

      default:
        if (_.current_layout_section() == kLayoutFunctionDeclarations &&
            _.in_function_body()) {
          return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                 << "A function must begin with a label";
        } else {
          if (_.in_block() == false) {
            return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
                   << spvOpcodeString(opcode) << " must appear in a block";
          }
        }
        break;
    }
  } else {
    return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
           << spvOpcodeString(opcode)
           << " cannot appear in a function declaration";
  }
  return SPV_SUCCESS;
}